

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O2

bool get_current_dms_text_descriptor(MXFWriter *writer,GenericStreamTextBasedSet **text_object)

{
  _List_node_base *p_Var1;
  MDD_t MVar2;
  long *plVar3;
  undefined8 uVar4;
  GenericStreamTextBasedSet *pGVar5;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  _List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  local_98;
  Result_t local_80 [104];
  
  local_98._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
  local_98._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
  local_98._M_impl._M_node._M_size = 0;
  plVar3 = (long *)(**(code **)(*(long *)writer + 0x10))();
  MVar2 = ASDCP::DefaultSMPTEDict();
  uVar4 = ASDCP::Dictionary::Type(MVar2);
  (**(code **)(*plVar3 + 0xb0))(local_80,plVar3,uVar4,&local_98);
  Kumu::Result_t::~Result_t(local_80);
  p_Var1 = local_98._M_impl._M_node.super__List_node_base._M_next;
  if (local_98._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
    if (local_98._M_impl._M_node.super__List_node_base._M_prev[1]._M_next == (_List_node_base *)0x0)
    {
      *text_object = (GenericStreamTextBasedSet *)0x0;
    }
    else {
      pGVar5 = (GenericStreamTextBasedSet *)
               __dynamic_cast(local_98._M_impl._M_node.super__List_node_base._M_prev[1]._M_next,
                              &ASDCP::MXF::InterchangeObject::typeinfo,
                              &ASDCP::MXF::GenericStreamTextBasedSet::typeinfo,0);
      *text_object = pGVar5;
      if (pGVar5 != (GenericStreamTextBasedSet *)0x0) goto LAB_0010da9d;
    }
    __assert_fail("text_object != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-wrap.cpp"
                  ,0x708,
                  "bool get_current_dms_text_descriptor(AS_02::ISXD::MXFWriter &, ASDCP::MXF::GenericStreamTextBasedSet *&)"
                 );
  }
LAB_0010da9d:
  std::__cxx11::
  _List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
  _M_clear(&local_98);
  return p_Var1 != (_List_node_base *)&local_98;
}

Assistant:

bool
get_current_dms_text_descriptor(AS_02::ISXD::MXFWriter& writer, ASDCP::MXF::GenericStreamTextBasedSet *&text_object)
{
  std::list<MXF::InterchangeObject*> object_list;
  writer.OP1aHeader().GetMDObjectsByType(DefaultSMPTEDict().ul(MDD_GenericStreamTextBasedSet), object_list);

  if ( object_list.empty() )
    {
      return false;
    }

  text_object = dynamic_cast<MXF::GenericStreamTextBasedSet*>(object_list.back());
  assert(text_object != 0);
  return true;
}